

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packer.c
# Opt level: O0

int source_segment_mix(mixed_segment *segment)

{
  byte bVar1;
  FILE *__stream;
  byte bVar2;
  uint uVar3;
  uint32_t uVar4;
  uint uVar5;
  mixed_transfer_function_from p_Var6;
  char *pcVar7;
  float fVar8;
  uint uVar9;
  uint32_t in_stack_ffffffffffffff38;
  uint32_t in_stack_ffffffffffffff3c;
  uint local_bc;
  uint local_b8;
  uint32_t i;
  uint32_t out_frames;
  mixed_channel_t c_1;
  float *source;
  uint32_t local_a0;
  int e;
  uint32_t bytes;
  mixed_channel_t c;
  SRC_DATA src_data;
  mixed_transfer_function_from decoder;
  uint32_t frames_to_bytes;
  uint32_t buffer_frames;
  uint32_t frames;
  mixed_channel_t channels;
  float *target;
  void *pack_data;
  mixed_pack *pack;
  pack_segment_data *data;
  mixed_segment *segment_local;
  
  pack = (mixed_pack *)segment->data;
  pack_data = pack->_data;
  data = (pack_segment_data *)segment;
  if (*(uint32_t *)((long)pack_data + 0x20) == pack[2].samplerate) {
    mixed_buffer_from_pack
              (*(undefined4 *)&pack[3]._data,pack->_data,&pack->size,&pack[2].field_0x24);
  }
  else {
    _frames = &pack[3].size;
    bVar1 = *(byte *)((long)pack_data + 0x1c);
    bVar2 = mixed_samplesize(*(mixed_encoding *)((long)pack_data + 0x18));
    uVar3 = (uint)bVar1 * (uint)bVar2;
    p_Var6 = mixed_translator_from(*(mixed_encoding *)((long)pack_data + 0x18));
    src_data.output_frames_gen = 0;
    src_data.output_frames = 0;
    src_data.input_frames_used = 0;
    src_data.data_out = (float *)0x0;
    src_data.input_frames = 0;
    src_data._48_8_ = (double)pack[2].samplerate / (double)*(uint *)((long)pack_data + 0x20);
    _bytes = _frames;
    src_data.data_in = (float *)&pack[0x36].write;
    do {
      frames_to_bytes = 0x200 / bVar1;
      for (e._3_1_ = 0; e._3_1_ < bVar1; e._3_1_ = e._3_1_ + 1) {
        in_stack_ffffffffffffff3c = frames_to_bytes;
        uVar4 = mixed_buffer_available_write(*(mixed_buffer **)(&pack->size + (ulong)e._3_1_ * 2));
        if (uVar4 <= in_stack_ffffffffffffff3c) {
          frames_to_bytes =
               mixed_buffer_available_write(*(mixed_buffer **)(&pack->size + (ulong)e._3_1_ * 2));
        }
        in_stack_ffffffffffffff38 = frames_to_bytes;
      }
      src_data.input_frames = (long)frames_to_bytes;
      local_a0 = 0xffffffff;
      mixed_pack_request_read(&target,&local_a0,(mixed_pack *)pack_data);
      uVar5 = frames_to_bytes;
      if (local_a0 / uVar3 <= frames_to_bytes) {
        uVar5 = local_a0 / uVar3;
      }
      if (target != (float *)0x0) {
        uVar9 = uVar5;
        fVar8 = (*p_Var6)(target,(float *)_bytes,'\x01',uVar5 * bVar1,*(float *)&pack[2].field_0x24,
                          *(float *)&pack[3]._data);
        *(float *)&pack[2].field_0x24 = fVar8;
        src_data.data_out = (float *)(ulong)uVar5;
        source._4_4_ = src_process((SRC_STATE *)
                                   CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                                   (SRC_DATA *)CONCAT44(frames_to_bytes,uVar9));
        __stream = _stderr;
        if (source._4_4_ != 0) {
          pcVar7 = src_strerror(source._4_4_);
          fprintf(__stream,"libsamplerate: %s\n",pcVar7);
          mixed_err(0xf);
          return 0;
        }
        uVar5 = (uint)src_data.output_frames;
        _out_frames = src_data.data_in;
        source._4_4_ = 0;
        for (i._3_1_ = 0; i._3_1_ < bVar1; i._3_1_ = i._3_1_ + 1) {
          local_b8 = (uint)src_data.input_frames_used;
          mixed_buffer_request_write
                    ((float **)&frames,&local_b8,
                     *(mixed_buffer **)(&pack->size + (ulong)i._3_1_ * 2));
          for (local_bc = 0; local_bc < local_b8; local_bc = local_bc + 1) {
            _frames[local_bc] = (uint32_t)_out_frames[local_bc * bVar1];
          }
          _out_frames = _out_frames + 1;
          mixed_buffer_finish_write(local_b8,*(mixed_buffer **)(&pack->size + (ulong)i._3_1_ * 2));
        }
        mixed_pack_finish_read(uVar5 * uVar3,(mixed_pack *)pack_data);
      }
      frames_to_bytes = uVar5;
    } while (frames_to_bytes != 0);
  }
  return 1;
}

Assistant:

int source_segment_mix(struct mixed_segment *segment){
  struct pack_segment_data *data = (struct pack_segment_data *)segment->data;
  struct mixed_pack *pack = data->pack;

  if(pack->samplerate == data->samplerate){
    mixed_buffer_from_pack(data->pack, data->buffers, &data->volume, data->target_volume);
  }else{
    void *restrict pack_data;
    float *restrict target = data->resample_in;
    mixed_channel_t channels = pack->channels;
    uint32_t frames, buffer_frames = 512 / channels;
    uint32_t frames_to_bytes = channels * mixed_samplesize(pack->encoding);
    mixed_transfer_function_from decoder = mixed_translator_from(pack->encoding);
    SRC_DATA src_data = {0};
    src_data.src_ratio = ((double)data->samplerate)/((double)pack->samplerate);
    src_data.data_in = target;
    src_data.data_out = data->resample_out;
    do{
      // Step 1: determine available space
      frames = buffer_frames;
      for(mixed_channel_t c=0; c<channels; ++c)
        frames = MIN(frames, mixed_buffer_available_write(data->buffers[c]));
      src_data.output_frames = frames;
      // Step 2: unpack to contiguous floats
      uint32_t bytes = UINT32_MAX;
      mixed_pack_request_read(&pack_data, &bytes, pack);
      frames = MIN(frames, bytes / frames_to_bytes);
      if(pack_data){
        data->volume = decoder(pack_data, (float*)src_data.data_in, 1, frames*channels, data->volume, data->target_volume);
        // Step 3: resample
        src_data.input_frames = frames;
        int e = src_process(data->resample_state, &src_data);
        if(e){
          fprintf(stderr, "libsamplerate: %s\n", src_strerror(e));
          mixed_err(MIXED_RESAMPLE_FAILED);
          return 0;
        }
        // Step 4: transfer from contigous to separate buffers
        frames = src_data.input_frames_used;
        float *restrict source = src_data.data_out;
        for(mixed_channel_t c=0; c<channels; ++c){
          uint32_t out_frames = src_data.output_frames_gen;
          mixed_buffer_request_write(&target, &out_frames, data->buffers[c]);
          for(uint32_t i=0; i<out_frames; ++i)
            target[i] = source[i*channels];
          source++;
          mixed_buffer_finish_write(out_frames, data->buffers[c]);
        }
        // Step 5: update consumed samples
        mixed_pack_finish_read(frames * frames_to_bytes, pack);
      }
    }while(frames);
  }
  return 1;
}